

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

void Omega_h::transfer_integ_error
               (Mesh *old_mesh,Mesh *new_mesh,CavsByBdryStatus *cavs,Reals *old_elem_densities,
               Reals *new_elem_densities,string *error_name,LOs *same_ents2old_ents,
               LOs *same_ents2new_ents,ConservedBools conserved_bools)

{
  bool bVar1;
  Int ent_dim;
  Int width;
  LO LVar2;
  Tag<double> *this;
  reference pvVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  reference pCVar6;
  Read<double> local_2c0;
  Write<double> local_2b0;
  undefined1 local_2a0 [8];
  Reals new_elem_errors;
  Cavs local_280;
  undefined1 local_240 [8];
  Cavs bdry_cavs;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  value_type *__range3_1;
  Read<double> local_1d8;
  Read<double> local_1c8;
  Cavs local_1b8;
  undefined1 local_178 [8];
  Cavs class_cavs;
  const_iterator __end3;
  const_iterator __begin3;
  value_type *__range3;
  size_t i;
  Read<int> local_108;
  Read<double> local_f8;
  Read<double> local_e8;
  Read<int> local_d8;
  Write<signed_char> local_c8;
  undefined1 local_b8 [8];
  Read<double> same_errors;
  string local_a0 [48];
  undefined1 local_70 [8];
  Write<double> new_elem_errors_w;
  Read<double> old_elem_errors;
  Int ncomps;
  Tag<double> *old_tag;
  Int dim;
  string *error_name_local;
  Reals *new_elem_densities_local;
  Reals *old_elem_densities_local;
  CavsByBdryStatus *cavs_local;
  Mesh *new_mesh_local;
  Mesh *old_mesh_local;
  
  begin_code("transfer_integ_error",(char *)0x0);
  ent_dim = Mesh::dim(old_mesh);
  this = Mesh::get_tag<double>(old_mesh,ent_dim,error_name);
  width = TagBase::ncomps(&this->super_TagBase);
  Tag<double>::array((Tag<double> *)&new_elem_errors_w.shared_alloc_.direct_ptr);
  LVar2 = Mesh::nelems(new_mesh);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a0,"",(allocator *)((long)&same_errors.write_.shared_alloc_.direct_ptr + 7));
  Write<double>::Write((Write<double> *)local_70,LVar2 * width,0.0,(string *)local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&same_errors.write_.shared_alloc_.direct_ptr + 7));
  Read<int>::Read(&local_d8,same_ents2old_ents);
  Read<double>::Read(&local_e8,(Read<double> *)&new_elem_errors_w.shared_alloc_.direct_ptr);
  unmap<double>((Omega_h *)&local_c8,&local_d8,(Read<signed_char> *)&local_e8,width);
  read<double>((Omega_h *)local_b8,&local_c8);
  Write<double>::~Write((Write<double> *)&local_c8);
  Read<double>::~Read(&local_e8);
  Read<int>::~Read(&local_d8);
  Read<double>::Read(&local_f8,(Read<double> *)local_b8);
  Read<int>::Read(&local_108,same_ents2new_ents);
  Write<double>::Write((Write<double> *)&i,(Write<double> *)local_70);
  map_into<double>((Read<signed_char> *)&local_f8,&local_108,(Write<signed_char> *)&i,width);
  Write<double>::~Write((Write<double> *)&i);
  Read<int>::~Read(&local_108);
  Read<double>::~Read(&local_f8);
  for (__range3 = (value_type *)0x0; __range3 < (value_type *)0x3;
      __range3 = (value_type *)
                 ((long)&(__range3->
                         super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1)) {
    pvVar3 = std::array<bool,_3UL>::operator[](&conserved_bools.this_time,(size_type)__range3);
    if ((*pvVar3 & 1U) == 0) {
      pvVar4 = std::
               array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>
               ::operator[](cavs,(size_type)__range3);
      pvVar5 = std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>::
               operator[](pvVar4,1);
      __end3 = std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::begin(pvVar5);
      class_cavs.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
           (void *)std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::end(pvVar5);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_Omega_h::Cavs_*,_std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>_>
                                         *)&class_cavs.keys2new_elems.ab2b.write_.shared_alloc_.
                                            direct_ptr), bVar1) {
        pCVar6 = __gnu_cxx::
                 __normal_iterator<const_Omega_h::Cavs_*,_std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>_>
                 ::operator*(&__end3);
        Cavs::Cavs((Cavs *)local_178,pCVar6);
        Cavs::Cavs(&local_1b8,(Cavs *)local_178);
        Read<double>::Read(&local_1c8,old_elem_densities);
        Read<double>::Read(&local_1d8,new_elem_densities);
        Write<double>::Write((Write<double> *)&__range3_1,(Write<double> *)local_70);
        introduce_class_integ_error
                  (old_mesh,new_mesh,&local_1b8,&local_1c8,&local_1d8,(Write<double> *)&__range3_1);
        Write<double>::~Write((Write<double> *)&__range3_1);
        Read<double>::~Read(&local_1d8);
        Read<double>::~Read(&local_1c8);
        Cavs::~Cavs(&local_1b8);
        Cavs::~Cavs((Cavs *)local_178);
        __gnu_cxx::
        __normal_iterator<const_Omega_h::Cavs_*,_std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>_>
        ::operator++(&__end3);
      }
    }
    pvVar3 = std::array<bool,_3UL>::operator[](&conserved_bools.always,(size_type)__range3);
    if ((*pvVar3 & 1U) == 0) {
      pvVar4 = std::
               array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>
               ::operator[](cavs,(size_type)__range3);
      pvVar5 = std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>::
               operator[](pvVar4,1);
      __end3_1 = std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::begin(pvVar5);
      bdry_cavs.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr =
           (void *)std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::end(pvVar5);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<const_Omega_h::Cavs_*,_std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>_>
                                 *)&bdry_cavs.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr),
            bVar1) {
        pCVar6 = __gnu_cxx::
                 __normal_iterator<const_Omega_h::Cavs_*,_std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>_>
                 ::operator*(&__end3_1);
        Cavs::Cavs((Cavs *)local_240,pCVar6);
        Cavs::Cavs(&local_280,(Cavs *)local_240);
        Write<double>::Write
                  ((Write<double> *)&new_elem_errors.write_.shared_alloc_.direct_ptr,
                   (Write<double> *)local_70);
        carry_class_bdry_integ_error
                  (old_mesh,new_mesh,&local_280,error_name,
                   (Write<double> *)&new_elem_errors.write_.shared_alloc_.direct_ptr);
        Write<double>::~Write((Write<double> *)&new_elem_errors.write_.shared_alloc_.direct_ptr);
        Cavs::~Cavs(&local_280);
        Cavs::~Cavs((Cavs *)local_240);
        __gnu_cxx::
        __normal_iterator<const_Omega_h::Cavs_*,_std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>_>
        ::operator++(&__end3_1);
      }
    }
  }
  Write<double>::Write(&local_2b0,(Write<double> *)local_70);
  Read<double>::Read((Read<double> *)local_2a0,&local_2b0);
  Write<double>::~Write(&local_2b0);
  Read<double>::Read(&local_2c0,(Read<double> *)local_2a0);
  Mesh::add_tag<double>(new_mesh,ent_dim,error_name,width,&local_2c0,false);
  Read<double>::~Read(&local_2c0);
  end_code();
  Read<double>::~Read((Read<double> *)local_2a0);
  Read<double>::~Read((Read<double> *)local_b8);
  Write<double>::~Write((Write<double> *)local_70);
  Read<double>::~Read((Read<double> *)&new_elem_errors_w.shared_alloc_.direct_ptr);
  return;
}

Assistant:

static void transfer_integ_error(Mesh* old_mesh, Mesh* new_mesh,
    CavsByBdryStatus const& cavs, Reals old_elem_densities,
    Reals new_elem_densities, std::string const& error_name,
    LOs same_ents2old_ents, LOs same_ents2new_ents,
    ConservedBools conserved_bools) {
  begin_code("transfer_integ_error");
  auto dim = old_mesh->dim();
  auto old_tag = old_mesh->get_tag<Real>(dim, error_name);
  auto ncomps = old_tag->ncomps();
  auto old_elem_errors = old_tag->array();
  auto new_elem_errors_w = Write<Real>(new_mesh->nelems() * ncomps, 0.0);
  auto same_errors = read(unmap(same_ents2old_ents, old_elem_errors, ncomps));
  map_into(same_errors, same_ents2new_ents, new_elem_errors_w, ncomps);
  for (std::size_t i = 0; i < 3; ++i) {
    if (!conserved_bools.this_time[i]) {
      for (auto class_cavs : cavs[i][CLASS_COLOR]) {
        introduce_class_integ_error(old_mesh, new_mesh, class_cavs,
            old_elem_densities, new_elem_densities, new_elem_errors_w);
      }
    }
    if (!conserved_bools.always[i]) {
      for (auto bdry_cavs : cavs[i][CLASS_COLOR]) {
        carry_class_bdry_integ_error(
            old_mesh, new_mesh, bdry_cavs, error_name, new_elem_errors_w);
      }
    }
  }
  auto new_elem_errors = Reals(new_elem_errors_w);
  new_mesh->add_tag(dim, error_name, ncomps, new_elem_errors);
  end_code();
}